

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definitions.cpp
# Opt level: O0

void __thiscall dg::dda::Definitions::join(Definitions *this,Definitions *rhs)

{
  DefinitionsMap<dg::dda::RWNode> *in_RDI;
  DefinitionsMap<dg::dda::RWNode> *unaff_retaddr;
  DefinitionsMap<dg::dda::RWNode> *in_stack_00000008;
  DefinitionsMap<dg::dda::RWNode> *in_stack_ffffffffffffff78;
  DefinitionsMap<dg::dda::RWNode> *in_stack_ffffffffffffffa8;
  DefinitionsMap<dg::dda::RWNode> *in_stack_ffffffffffffffb0;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  
  DefinitionsMap<dg::dda::RWNode>::add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  DefinitionsMap<dg::dda::RWNode>::intersect(in_stack_00000008,unaff_retaddr);
  DefinitionsMap<dg::dda::RWNode>::operator=(in_RDI,in_stack_ffffffffffffff78);
  DefinitionsMap<dg::dda::RWNode>::~DefinitionsMap((DefinitionsMap<dg::dda::RWNode> *)0x19377c);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
  ::__normal_iterator<dg::dda::RWNode**>
            ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_RDI,
             (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              *)in_stack_ffffffffffffff78);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff78);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff78);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Definitions::join(const Definitions &rhs) {
    definitions.add(rhs.definitions);
    kills = kills.intersect(rhs.kills);
    unknownWrites.insert(unknownWrites.end(), rhs.unknownWrites.begin(),
                         rhs.unknownWrites.end());
}